

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O2

void __thiscall OPL::DOSBox::DBOPL::Chip::GenerateBlock2(Chip *this,Bitu total,Bit32s *output)

{
  Bit32u BVar1;
  long *plVar2;
  Channel *pCVar3;
  code *pcVar4;
  ulong uVar5;
  
  for (; total != 0; total = total - BVar1) {
    BVar1 = ForwardLFO(this,total);
    uVar5 = (ulong)BVar1;
    memset(output,0,uVar5 * 4);
    pCVar3 = this->chan;
    while (pCVar3 < this->chan + 9) {
      pcVar4 = (code *)pCVar3->synthHandler;
      plVar2 = (long *)((long)&pCVar3->op[0].volHandler + *(long *)&pCVar3->field_0xd8);
      if (((ulong)pcVar4 & 1) != 0) {
        pcVar4 = *(code **)(pcVar4 + *plVar2 + -1);
      }
      pCVar3 = (Channel *)(*pcVar4)(plVar2,this,uVar5,output);
    }
    output = output + uVar5;
  }
  return;
}

Assistant:

void Chip::GenerateBlock2( Bitu total, Bit32s* output ) {
	while ( total > 0 ) {
		Bit32u samples = ForwardLFO( total );
		memset(output, 0, sizeof(Bit32s) * samples);
		int count = 0;
		for( Channel* ch = chan; ch < chan + 9; ) {
			count++;
			ch = (ch->*(ch->synthHandler))( this, samples, output );
		}
		total -= samples;
		output += samples;
	}
}